

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall mario::EventLoop::EventLoop(EventLoop *this)

{
  long lVar1;
  int fdArg;
  pid_t pVar2;
  Writer *pWVar3;
  Channel *pCVar4;
  EPoller *this_00;
  TimerQueue *this_01;
  long *in_FS_OFFSET;
  Writer local_c0;
  _Bind<void_(mario::EventLoop::*(mario::EventLoop_*))()> local_48;
  
  this->_callingPendingFunctors = false;
  fdArg = eventfd(0,0x80800);
  if (fdArg < 0) {
    local_c0._vptr_Writer = (_func_int **)&PTR__Writer_0012be20;
    local_c0.m_msg = (LogMessage *)0x0;
    local_c0.m_level = Fatal;
    local_c0.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
    ;
    local_c0.m_line = 0x18;
    local_c0.m_func = "int createEventfd()";
    local_c0.m_verboseLevel = 0;
    local_c0.m_logger = (Logger *)0x0;
    local_c0.m_proceed = false;
    local_c0.m_messageBuilder.m_logger = (Logger *)0x0;
    local_c0.m_messageBuilder.m_containerLogSeperator = "";
    local_c0.m_dispatchAction = NormalLog;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_c0,1,"default");
    el::base::Writer::operator<<(pWVar3,(char (*) [18])"Failed in eventfd");
    el::base::Writer::~Writer(&local_c0);
  }
  this->_wakeupFd = fdArg;
  pCVar4 = (Channel *)operator_new(0xa0);
  Channel::Channel(pCVar4,this,fdArg);
  (this->_wakeupChannel)._M_t.
  super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
  super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
  super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl = pCVar4;
  MutexLock::MutexLock(&this->_mutex);
  *(undefined8 *)
   ((long)&(this->_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pVar2 = CurrentThread::tid();
  this->_threadId = pVar2;
  Timestamp::Timestamp(&this->_pollReturnTime);
  this_00 = (EPoller *)operator_new(0x58);
  EPoller::EPoller(this_00,this);
  (this->_poller)._M_t.super___uniq_ptr_impl<mario::EPoller,_std::default_delete<mario::EPoller>_>.
  _M_t.super__Tuple_impl<0UL,_mario::EPoller_*,_std::default_delete<mario::EPoller>_>.
  super__Head_base<0UL,_mario::EPoller_*,_false>._M_head_impl = this_00;
  this_01 = (TimerQueue *)operator_new(0x148);
  TimerQueue::TimerQueue(this_01,this);
  (this->_timerQueue)._M_t.
  super___uniq_ptr_impl<mario::TimerQueue,_std::default_delete<mario::TimerQueue>_>._M_t.
  super__Tuple_impl<0UL,_mario::TimerQueue_*,_std::default_delete<mario::TimerQueue>_>.
  super__Head_base<0UL,_mario::TimerQueue_*,_false>._M_head_impl = this_01;
  (this->_activeChannels).super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_activeChannels).super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_activeChannels).super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._vptr_Writer = (_func_int **)&PTR__Writer_0012be20;
  local_c0.m_msg = (LogMessage *)0x0;
  local_c0.m_level = Info;
  local_c0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
  ;
  local_c0.m_line = 0x27;
  local_c0.m_func = "mario::EventLoop::EventLoop()";
  local_c0.m_verboseLevel = 0;
  local_c0.m_logger = (Logger *)0x0;
  local_c0.m_proceed = false;
  local_c0.m_messageBuilder.m_logger = (Logger *)0x0;
  local_c0.m_messageBuilder.m_containerLogSeperator = "";
  local_c0.m_dispatchAction = NormalLog;
  local_c0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar3 = el::base::Writer::construct(&local_c0,1,"default");
  pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [18])"EventLoop created");
  local_48._M_f = (offset_in_EventLoop_to_subr)this;
  pWVar3 = el::base::Writer::operator<<(pWVar3,(EventLoop **)&local_48);
  pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [12])" in thread ");
  el::base::Writer::operator<<(pWVar3,&this->_threadId);
  el::base::Writer::~Writer(&local_c0);
  if (in_FS_OFFSET[-2] == 0) {
    in_FS_OFFSET[-2] = (long)this;
  }
  else {
    lVar1 = *in_FS_OFFSET;
    local_c0._vptr_Writer = (_func_int **)&PTR__Writer_0012be20;
    local_c0.m_msg = (LogMessage *)0x0;
    local_c0.m_level = Fatal;
    local_c0.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
    ;
    local_c0.m_line = 0x29;
    local_c0.m_func = "mario::EventLoop::EventLoop()";
    local_c0.m_verboseLevel = 0;
    local_c0.m_logger = (Logger *)0x0;
    local_c0.m_proceed = false;
    local_c0.m_messageBuilder.m_logger = (Logger *)0x0;
    local_c0.m_messageBuilder.m_containerLogSeperator = "";
    local_c0.m_dispatchAction = NormalLog;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_c0,1,"default");
    pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [19])"Another EventLoop ");
    pWVar3 = el::base::Writer::operator<<(pWVar3,(EventLoop **)(lVar1 + -0x10));
    pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [24])" exists in this thread ");
    el::base::Writer::operator<<(pWVar3,&this->_threadId);
    el::base::Writer::~Writer(&local_c0);
  }
  pCVar4 = (this->_wakeupChannel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  local_48._M_f = (offset_in_EventLoop_to_subr)handleRead;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_mario::EventLoop_*>.
  super__Head_base<0UL,_mario::EventLoop_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mario::EventLoop_*>)(_Tuple_impl<0UL,_mario::EventLoop_*>)this;
  std::function<void(mario::Timestamp)>::
  function<std::_Bind<void(mario::EventLoop::*(mario::EventLoop*))()>,void>
            ((function<void(mario::Timestamp)> *)&local_c0,&local_48);
  std::function<void_(mario::Timestamp)>::operator=
            (&pCVar4->_readCallback,(function<void_(mario::Timestamp)> *)&local_c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_c0);
  Channel::enableReading
            ((this->_wakeupChannel)._M_t.
             super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
             super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
             super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl);
  return;
}

Assistant:

EventLoop::EventLoop() 
	: _looping(false)
    , _poller(new EPoller(this))
    , _timerQueue(new TimerQueue(this))
	, _threadId(CurrentThread::tid()) 
    , _callingPendingFunctors(false)
    , _wakeupFd(createEventfd())
    , _wakeupChannel(new Channel(this, _wakeupFd))
{

	LOG(INFO) << "EventLoop created" << this << " in thread " << _threadId;
	if (t_loopInThisThread) {
		LOG(FATAL) << "Another EventLoop " << t_loopInThisThread
				  << " exists in this thread " << _threadId;
	} else {
		t_loopInThisThread = this;
	}

    _wakeupChannel -> setReadCallback(
            std::bind(&EventLoop::handleRead, this)
        );
    _wakeupChannel -> enableReading();
}